

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_weapons.cpp
# Opt level: O0

int AF_AWeapon_A_ZoomFactor
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  DObject *this;
  DObject *this_00;
  VMValue *pVVar1;
  bool bVar2;
  bool local_5a;
  bool local_57;
  uint local_54;
  double dStack_50;
  int flags;
  double zoom;
  FStateParamInfo *stateinfo;
  AActor *stateowner;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x829,
                  "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar2 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar2 = true, (param->field_0).field_1.atag != 1)) {
    bVar2 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (!bVar2) {
    __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x829,
                  "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  this = (DObject *)(param->field_0).field_1.a;
  local_57 = true;
  if (this != (DObject *)0x0) {
    local_57 = DObject::IsKindOf(this,AActor::RegistrationInfo.MyClass);
  }
  if (local_57 == false) {
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x829,
                  "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  if (numparam < 2) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                  ,0x829,
                  "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)")
    ;
  }
  bVar2 = false;
  if ((param[1].field_0.field_3.Type == '\x03') &&
     (bVar2 = true, param[1].field_0.field_1.atag != 1)) {
    bVar2 = param[1].field_0.field_1.a == (void *)0x0;
  }
  if (bVar2) {
    this_00 = (DObject *)param[1].field_0.field_1.a;
    local_5a = true;
    if (this_00 != (DObject *)0x0) {
      local_5a = DObject::IsKindOf(this_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_5a == false) {
      __assert_fail("stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                    ,0x829,
                    "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (numparam < 3) {
      __assert_fail("(paramnum) < numparam",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                    ,0x829,
                    "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (param[2].field_0.field_3.Type != '\x03') {
      __assert_fail("param[paramnum].Type == REGT_POINTER",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                    ,0x829,
                    "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                   );
    }
    if (numparam < 4) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      if ((pVVar1->field_0).field_3.Type != '\x01') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                      ,0x82a,
                      "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,3);
      dStack_50 = (pVVar1->field_0).f;
    }
    else {
      if (param[3].field_0.field_3.Type != '\x01') {
        __assert_fail("(param[paramnum]).Type == REGT_FLOAT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                      ,0x82a,
                      "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      dStack_50 = param[3].field_0.f;
    }
    if (numparam < 5) {
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      if ((pVVar1->field_0).field_3.Type != '\0') {
        __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                      ,0x82b,
                      "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      pVVar1 = TArray<VMValue,_VMValue>::operator[](defaultparam,4);
      local_54 = (pVVar1->field_0).i;
    }
    else {
      if (param[4].field_0.field_3.Type != '\0') {
        __assert_fail("(param[paramnum]).Type == REGT_INT",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                      ,0x82b,
                      "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                     );
      }
      local_54 = param[4].field_0.i;
    }
    if ((this[0xe]._vptr_DObject != (_func_int **)0x0) &&
       (this[0xe]._vptr_DObject[0x1a] != (_func_int *)0x0)) {
      dStack_50 = clamp<double>(dStack_50,0.1,50.0);
      dStack_50 = 1.0 / dStack_50;
      if ((local_54 & 1) != 0) {
        *(float *)((long)this[0xe]._vptr_DObject + 0x5c) =
             (float)((double)*(float *)(this[0xe]._vptr_DObject + 0xb) * dStack_50);
      }
      if ((local_54 & 2) != 0) {
        dStack_50 = -dStack_50;
      }
      *(float *)(this[0xe]._vptr_DObject[0x1a] + 0x598) = (float)dStack_50;
    }
    return 0;
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_inventory/a_weapons.cpp"
                ,0x829,
                "int AF_AWeapon_A_ZoomFactor(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AWeapon, A_ZoomFactor)
{
	PARAM_ACTION_PROLOGUE(AActor);
	PARAM_FLOAT_DEF(zoom);
	PARAM_INT_DEF(flags);

	if (self->player != NULL && self->player->ReadyWeapon != NULL)
	{
		zoom = 1 / clamp(zoom, 0.1, 50.0);
		if (flags & 1)
		{ // Make the zoom instant.
			self->player->FOV = float(self->player->DesiredFOV * zoom);
		}
		if (flags & 2)
		{ // Disable pitch/yaw scaling.
			zoom = -zoom;
		}
		self->player->ReadyWeapon->FOVScale = float(zoom);
	}
	return 0;
}